

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainparams.cpp
# Opt level: O1

void __thiscall CTestNetParams::CTestNetParams(CTestNetParams *this)

{
  uint256 *puVar1;
  CBlock *this_00;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined8 uVar3;
  pointer puVar4;
  void *pvVar5;
  _Base_ptr p_Var6;
  undefined1 auVar7 [16];
  _Base_ptr p_Var8;
  base_blob<256U> *pbVar9;
  undefined1 *puVar10;
  long lVar11;
  undefined1 *puVar12;
  undefined8 *puVar13;
  CBlock *pCVar14;
  CAmount *in_R9;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  initializer_list<std::pair<const_int,_uint256>_> __l;
  allocator_type local_d1;
  undefined8 local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  pointer local_b8;
  uchar auStack_b0 [24];
  undefined1 local_98 [36];
  uchar auStack_74 [4];
  size_t local_70;
  uchar local_68 [32];
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_48;
  bool local_30;
  bool bStack_2f;
  bool local_2e;
  long local_20;
  
  bVar15 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  CChainParams::CChainParams(&this->super_CChainParams);
  (this->super_CChainParams).m_chain_type = TESTNET;
  (this->super_CChainParams).consensus.signet_blocks = false;
  puVar4 = (this->super_CChainParams).consensus.signet_challenge.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).consensus.signet_challenge.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->super_CChainParams).consensus.signet_challenge.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  (this->super_CChainParams).consensus.nSubsidyHalvingInterval = 210000;
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x5;
  local_98[1] = 0xb1;
  local_98[2] = '2';
  local_98[3] = 0xa4;
  local_98[4] = 0xf7;
  local_98[5] = 'J';
  local_98[6] = 0x87;
  local_98[7] = 0x99;
  local_98[8] = 0xa5;
  local_98[9] = 0x7a;
  local_98[10] = 0x42;
  local_98[0xb] = 2;
  local_98[0xc] = 0xd0;
  local_98[0xd] = 0xee;
  local_98[0xe] = 0xb0;
  local_98[0xf] = 0x96;
  local_98[0x10] = '\x12';
  local_98[0x11] = 0xcc;
  local_98[0x12] = '\b';
  local_98[0x13] = 0xd2;
  local_98[0x14] = 0x95;
  local_98[0x15] = '@';
  local_98[0x16] = '\x1f';
  local_98[0x17] = '\0';
  local_98[0x18] = '|';
  local_98[0x19] = 'E';
  local_98[0x1a] = '0';
  local_98[0x1b] = 0xdd;
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  auVar7._12_4_ = 0;
  auVar7._0_12_ = stack0xffffffffffffff3c;
  _local_c8 = auVar7 << 0x20;
  std::
  map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
  ::emplace<uint256,__0>
            ((map<uint256,unsigned_int,std::less<uint256>,std::allocator<std::pair<uint256_const,unsigned_int>>>
              *)&(this->super_CChainParams).consensus.script_flag_exceptions,(uint256 *)local_98,
             (anon_enum_32 *)local_c8);
  (this->super_CChainParams).consensus.BIP34Height = 0x5277;
  puVar1 = &(this->super_CChainParams).consensus.BIP34Hash;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xf8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x8e;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xcd;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0x99;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\x12';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = 0xd0;
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\r';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '?';
  pbVar9 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[8] = '\\';
  (pbVar9->m_data)._M_elems[9] = '*';
  (pbVar9->m_data)._M_elems[10] = 0x8e;
  (pbVar9->m_data)._M_elems[0xb] = '\x0f';
  (pbVar9->m_data)._M_elems[0xc] = 'P';
  (pbVar9->m_data)._M_elems[0xd] = 'A';
  (pbVar9->m_data)._M_elems[0xe] = '}';
  (pbVar9->m_data)._M_elems[0xf] = '>';
  pbVar9 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x10] = 'A';
  (pbVar9->m_data)._M_elems[0x11] = '\\';
  (pbVar9->m_data)._M_elems[0x12] = 'u';
  (pbVar9->m_data)._M_elems[0x13] = 0xb3;
  (pbVar9->m_data)._M_elems[0x14] = 0xab;
  (pbVar9->m_data)._M_elems[0x15] = 0xe5;
  (pbVar9->m_data)._M_elems[0x16] = 0x84;
  (pbVar9->m_data)._M_elems[0x17] = '4';
  pbVar9 = &(this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x18] = 'm';
  (pbVar9->m_data)._M_elems[0x19] = 0xa9;
  (pbVar9->m_data)._M_elems[0x1a] = 0xb3;
  (pbVar9->m_data)._M_elems[0x1b] = '#';
  *(undefined8 *)
   ((this->super_CChainParams).consensus.BIP34Hash.super_base_blob<256U>.m_data._M_elems + 0x1c) =
       0x8e0fd00000000;
  (this->super_CChainParams).consensus.BIP66Height = 0x50c18;
  (this->super_CChainParams).consensus.CSVHeight = 0xbc040;
  (this->super_CChainParams).consensus.SegwitHeight = 0xcbc40;
  (this->super_CChainParams).consensus.MinBIP9WarningHeight = 0xcc420;
  puVar1 = &(this->super_CChainParams).consensus.powLimit;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xff;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[4] = 0xff;
  (pbVar9->m_data)._M_elems[5] = 0xff;
  (pbVar9->m_data)._M_elems[6] = 0xff;
  (pbVar9->m_data)._M_elems[7] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[8] = 0xff;
  (pbVar9->m_data)._M_elems[9] = 0xff;
  (pbVar9->m_data)._M_elems[10] = 0xff;
  (pbVar9->m_data)._M_elems[0xb] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0xc] = 0xff;
  (pbVar9->m_data)._M_elems[0xd] = 0xff;
  (pbVar9->m_data)._M_elems[0xe] = 0xff;
  (pbVar9->m_data)._M_elems[0xf] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0xc] = 0xff;
  (pbVar9->m_data)._M_elems[0xd] = 0xff;
  (pbVar9->m_data)._M_elems[0xe] = 0xff;
  (pbVar9->m_data)._M_elems[0xf] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x10] = 0xff;
  (pbVar9->m_data)._M_elems[0x11] = 0xff;
  (pbVar9->m_data)._M_elems[0x12] = 0xff;
  (pbVar9->m_data)._M_elems[0x13] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x14] = 0xff;
  (pbVar9->m_data)._M_elems[0x15] = 0xff;
  (pbVar9->m_data)._M_elems[0x16] = 0xff;
  (pbVar9->m_data)._M_elems[0x17] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x18] = 0xff;
  (pbVar9->m_data)._M_elems[0x19] = 0xff;
  (pbVar9->m_data)._M_elems[0x1a] = 0xff;
  (pbVar9->m_data)._M_elems[0x1b] = 0xff;
  pbVar9 = &(this->super_CChainParams).consensus.powLimit.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x1c] = '\0';
  (pbVar9->m_data)._M_elems[0x1d] = '\0';
  (pbVar9->m_data)._M_elems[0x1e] = '\0';
  (pbVar9->m_data)._M_elems[0x1f] = '\0';
  (this->super_CChainParams).consensus.nPowTargetTimespan = 0x127500;
  (this->super_CChainParams).consensus.nPowTargetSpacing = 600;
  (this->super_CChainParams).consensus.fPowAllowMinDifficultyBlocks = true;
  (this->super_CChainParams).consensus.enforce_BIP94 = false;
  (this->super_CChainParams).consensus.fPowNoRetargeting = false;
  (this->super_CChainParams).consensus.nRuleChangeActivationThreshold = 0x5e8;
  (this->super_CChainParams).consensus.nMinerConfirmationWindow = 0x7e0;
  (this->super_CChainParams).consensus.vDeployments[0].bit = 0x1c;
  (this->super_CChainParams).consensus.vDeployments[0].nStartTime = -2;
  (this->super_CChainParams).consensus.vDeployments[0].nTimeout = 0x7fffffffffffffff;
  (this->super_CChainParams).consensus.vDeployments[0].min_activation_height = 0;
  (this->super_CChainParams).consensus.vDeployments[1].bit = 2;
  (this->super_CChainParams).consensus.vDeployments[1].nStartTime = 0x60835f80;
  (this->super_CChainParams).consensus.vDeployments[1].nTimeout = 0x61131300;
  (this->super_CChainParams).consensus.vDeployments[1].min_activation_height = 0;
  puVar1 = &(this->super_CChainParams).consensus.nMinimumChainWork;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xa9;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\x1f';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xb6;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = 0xe8;
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 'k';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\x16';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 0x95;
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 0x96;
  pbVar9 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[8] = ' ';
  (pbVar9->m_data)._M_elems[9] = '\x0f';
  pbVar9 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[10] = '\0';
  (pbVar9->m_data)._M_elems[0xb] = '\0';
  (pbVar9->m_data)._M_elems[0xc] = '\0';
  (pbVar9->m_data)._M_elems[0xd] = '\0';
  (pbVar9->m_data)._M_elems[0xe] = '\0';
  (pbVar9->m_data)._M_elems[0xf] = '\0';
  (pbVar9->m_data)._M_elems[0x10] = '\0';
  (pbVar9->m_data)._M_elems[0x11] = '\0';
  (pbVar9->m_data)._M_elems[0x12] = '\0';
  (pbVar9->m_data)._M_elems[0x13] = '\0';
  (pbVar9->m_data)._M_elems[0x14] = '\0';
  (pbVar9->m_data)._M_elems[0x15] = '\0';
  (pbVar9->m_data)._M_elems[0x16] = '\0';
  (pbVar9->m_data)._M_elems[0x17] = '\0';
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  pbVar9 = &(this->super_CChainParams).consensus.nMinimumChainWork.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x18] = '\0';
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  (pbVar9->m_data)._M_elems[0x1c] = '\0';
  (pbVar9->m_data)._M_elems[0x1d] = '\0';
  (pbVar9->m_data)._M_elems[0x1e] = '\0';
  (pbVar9->m_data)._M_elems[0x1f] = '\0';
  puVar1 = &(this->super_CChainParams).consensus.defaultAssumeValid;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = 0xad;
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = 0x90;
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = 0xfc;
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\t';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = 0xda;
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\x11';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = 'x';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = 'W';
  pbVar9 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[8] = '?';
  (pbVar9->m_data)._M_elems[9] = '\x1f';
  (pbVar9->m_data)._M_elems[10] = ' ';
  (pbVar9->m_data)._M_elems[0xb] = 0xf9;
  (pbVar9->m_data)._M_elems[0xc] = 0xce;
  (pbVar9->m_data)._M_elems[0xd] = 'Z';
  (pbVar9->m_data)._M_elems[0xe] = 199;
  (pbVar9->m_data)._M_elems[0xf] = 0xe8;
  pbVar9 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x10] = '\b';
  (pbVar9->m_data)._M_elems[0x11] = 'c';
  (pbVar9->m_data)._M_elems[0x12] = '8';
  (pbVar9->m_data)._M_elems[0x13] = 0x9f;
  (pbVar9->m_data)._M_elems[0x14] = 'l';
  (pbVar9->m_data)._M_elems[0x15] = 0xa6;
  (pbVar9->m_data)._M_elems[0x16] = 0xb1;
  (pbVar9->m_data)._M_elems[0x17] = 'e';
  (this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>.m_data._M_elems
  [0x18] = '\x04';
  pbVar9 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x19] = '\0';
  (pbVar9->m_data)._M_elems[0x1a] = '\0';
  (pbVar9->m_data)._M_elems[0x1b] = '\0';
  (pbVar9->m_data)._M_elems[0x1c] = '\0';
  pbVar9 = &(this->super_CChainParams).consensus.defaultAssumeValid.super_base_blob<256U>;
  (pbVar9->m_data)._M_elems[0x1c] = '\0';
  (pbVar9->m_data)._M_elems[0x1d] = '\0';
  (pbVar9->m_data)._M_elems[0x1e] = '\0';
  (pbVar9->m_data)._M_elems[0x1f] = '\0';
  *(undefined4 *)(this->super_CChainParams).pchMessageStart._M_elems = 0x709110b;
  (this->super_CChainParams).nDefaultPort = 0x479d;
  (this->super_CChainParams).nPruneAfterHeight = 1000;
  (this->super_CChainParams).m_assumed_blockchain_size = 0x5d;
  (this->super_CChainParams).m_assumed_chain_state_size = 0x13;
  local_d0 = 5000000000;
  CreateGenesisBlock((CBlock *)local_98,0x4d49e5da,0x18aea41a,0x1d00ffff,(int32_t)&local_d0,in_R9);
  this_00 = &(this->super_CChainParams).genesis;
  puVar13 = (undefined8 *)local_98;
  pCVar14 = this_00;
  for (lVar11 = 10; lVar11 != 0; lVar11 = lVar11 + -1) {
    uVar3 = *puVar13;
    (pCVar14->super_CBlockHeader).nVersion = (int)uVar3;
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
         (char)((ulong)uVar3 >> 0x20);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
         (char)((ulong)uVar3 >> 0x28);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
         (char)((ulong)uVar3 >> 0x30);
    (pCVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
         (char)((ulong)uVar3 >> 0x38);
    puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
    pCVar14 = (CBlock *)((long)pCVar14 + (ulong)bVar15 * -0x10 + 8);
  }
  pvVar2 = &(this->super_CChainParams).genesis.vtx;
  local_c8 = (undefined1  [8])
             (pvVar2->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  uStack_c0 = (pvVar2->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_b8 = (this->super_CChainParams).genesis.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_CChainParams).genesis.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_c8);
  (this->super_CChainParams).genesis.m_checked_merkle_root = local_2e;
  (this->super_CChainParams).genesis.fChecked = local_30;
  (this->super_CChainParams).genesis.m_checked_witness_commitment = bStack_2f;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_48);
  CBlockHeader::GetHash((uint256 *)local_98,&this_00->super_CBlockHeader);
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x10) =
       CONCAT17(local_98[0x17],
                CONCAT16(local_98[0x16],
                         CONCAT15(local_98[0x15],
                                  CONCAT14(local_98[0x14],
                                           CONCAT13(local_98[0x13],
                                                    CONCAT12(local_98[0x12],
                                                             CONCAT11(local_98[0x11],local_98[0x10])
                                                            ))))));
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 0x18) =
       CONCAT17(local_98[0x1f],
                CONCAT16(local_98[0x1e],
                         CONCAT15(local_98[0x1d],
                                  CONCAT14(local_98[0x1c],
                                           CONCAT13(local_98[0x1b],
                                                    CONCAT12(local_98[0x1a],
                                                             CONCAT11(local_98[0x19],local_98[0x18])
                                                            ))))));
  *(ulong *)(this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
            _M_elems =
       CONCAT17(local_98[7],
                CONCAT16(local_98[6],
                         CONCAT15(local_98[5],
                                  CONCAT14(local_98[4],
                                           CONCAT13(local_98[3],
                                                    CONCAT12(local_98[2],
                                                             CONCAT11(local_98[1],local_98[0])))))))
  ;
  *(ulong *)((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
             _M_elems + 8) =
       CONCAT17(local_98[0xf],
                CONCAT16(local_98[0xe],
                         CONCAT15(local_98[0xd],
                                  CONCAT14(local_98[0xc],
                                           CONCAT13(local_98[0xb],
                                                    CONCAT12(local_98[10],
                                                             CONCAT11(local_98[9],local_98[8])))))))
  ;
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x43;
  local_98[1] = 'I';
  local_98[2] = '\x7f';
  local_98[3] = 0xd7;
  local_98[4] = 0xf8;
  local_98[5] = '&';
  local_98[6] = 0x95;
  local_98[7] = 'q';
  local_98[8] = 8;
  local_98[9] = 0xf4;
  local_98[10] = 0xa3;
  local_98[0xb] = 0xf;
  local_98[0xc] = 0xd9;
  local_98[0xd] = 0xce;
  local_98[0xe] = 0xc3;
  local_98[0xf] = 0xae;
  local_98[0x10] = 0xba;
  local_98[0x11] = 'y';
  local_98[0x12] = 0x97;
  local_98[0x13] = ' ';
  local_98[0x14] = 0x84;
  local_98[0x15] = 0xe9;
  local_98[0x16] = '\x0e';
  local_98[0x17] = 0xad;
  local_98[0x18] = '\x01';
  local_98[0x19] = 0xea;
  local_98[0x1a] = '3';
  local_98[0x1b] = '\t';
  local_98[0x1c] = '\0';
  local_98[0x1d] = '\0';
  local_98[0x1e] = '\0';
  local_98[0x1f] = '\0';
  auVar17[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x10] == 0xba);
  auVar17[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x11] == 'y');
  auVar17[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x12] == 0x97);
  auVar17[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x13] == ' ');
  auVar17[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x14] == 0x84);
  auVar17[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x15] == 0xe9);
  auVar17[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x16] == '\x0e');
  auVar17[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x17] == 0xad);
  auVar17[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x18] == '\x01');
  auVar17[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0x19] == 0xea);
  auVar17[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[0x1a] == '3');
  auVar17[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1b] == '\t');
  auVar17[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1c] == '\0');
  auVar17[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1d] == '\0');
  auVar17[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1e] == '\0');
  auVar17[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0x1f] == '\0');
  auVar16[0] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[0] == 'C');
  auVar16[1] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[1] == 'I');
  auVar16[2] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[2] == '\x7f');
  auVar16[3] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[3] == 0xd7);
  auVar16[4] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[4] == 0xf8);
  auVar16[5] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[5] == '&');
  auVar16[6] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[6] == 0x95);
  auVar16[7] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[7] == 'q');
  auVar16[8] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[8] == '\b');
  auVar16[9] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data.
                 _M_elems[9] == 0xf4);
  auVar16[10] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.m_data
                  ._M_elems[10] == 0xa3);
  auVar16[0xb] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xb] == '\x0f');
  auVar16[0xc] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xc] == 0xd9);
  auVar16[0xd] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xd] == 0xce);
  auVar16[0xe] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xe] == 0xc3);
  auVar16[0xf] = -((this->super_CChainParams).consensus.hashGenesisBlock.super_base_blob<256U>.
                   m_data._M_elems[0xf] == 0xae);
  auVar17 = auVar17 & auVar16;
  if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("consensus.hashGenesisBlock == uint256{\"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x102,"CTestNetParams::CTestNetParams()");
  }
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x3b;
  local_98[1] = 0xa3;
  local_98[2] = 0xed;
  local_98[3] = 0xfd;
  local_98[4] = 'z';
  local_98[5] = '{';
  local_98[6] = '\x12';
  local_98[7] = 0xb2;
  local_98[8] = 0x7a;
  local_98[9] = 199;
  local_98[10] = 0x2c;
  local_98[0xb] = 0x3e;
  local_98[0xc] = 'g';
  local_98[0xd] = 'v';
  local_98[0xe] = 0x8f;
  local_98[0xf] = 'a';
  local_98[0x10] = '\x7f';
  local_98[0x11] = 200;
  local_98[0x12] = '\x1b';
  local_98[0x13] = 0xc3;
  local_98[0x14] = 0x88;
  local_98[0x15] = 0x8a;
  local_98[0x16] = 'Q';
  local_98[0x17] = '2';
  local_98[0x18] = ':';
  local_98[0x19] = 0x9f;
  local_98[0x1a] = 0xb8;
  local_98[0x1b] = 0xaa;
  local_98[0x1c] = 'K';
  local_98[0x1d] = '\x1e';
  local_98[0x1e] = '^';
  local_98[0x1f] = 'J';
  auVar19[0] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x10) ==
                '\x7f');
  auVar19[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x11) ==
                200);
  auVar19[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x12) ==
                '\x1b');
  auVar19[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x13) ==
                0xc3);
  auVar19[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x14) ==
                0x88);
  auVar19[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x15) ==
                0x8a);
  auVar19[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x16) ==
                'Q');
  auVar19[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x17) ==
                '2');
  auVar19[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x18) ==
                ':');
  auVar19[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x19) ==
                0x9f);
  auVar19[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1a) ==
                 0xb8);
  auVar19[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1b) ==
                  0xaa);
  auVar19[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1c) ==
                  'K');
  auVar19[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1d) ==
                  '\x1e');
  auVar19[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1e) ==
                  '^');
  auVar19[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0x1f) ==
                  'J');
  auVar18[0] = -((this->super_CChainParams).genesis.super_CBlockHeader.hashMerkleRoot.
                 super_base_blob<256U>.m_data._M_elems[0] == ';');
  auVar18[1] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 1) == 0xa3)
  ;
  auVar18[2] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 2) == 0xed)
  ;
  auVar18[3] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 3) == 0xfd)
  ;
  auVar18[4] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 4) == 'z');
  auVar18[5] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 5) == '{');
  auVar18[6] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 6) ==
                '\x12');
  auVar18[7] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 7) == 0xb2)
  ;
  auVar18[8] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 8) == 'z');
  auVar18[9] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                  hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 9) == 199);
  auVar18[10] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                   hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 10) == ','
                 );
  auVar18[0xb] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xb) ==
                  '>');
  auVar18[0xc] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xc) ==
                  'g');
  auVar18[0xd] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xd) ==
                  'v');
  auVar18[0xe] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xe) ==
                  0x8f);
  auVar18[0xf] = -(*(uchar *)((long)(this->super_CChainParams).genesis.super_CBlockHeader.
                                    hashMerkleRoot.super_base_blob<256U>.m_data._M_elems + 0xf) ==
                  'a');
  auVar18 = auVar18 & auVar19;
  if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
    __assert_fail("genesis.hashMerkleRoot == uint256{\"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b\"}"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/kernel/chainparams.cpp"
                  ,0x103,"CTestNetParams::CTestNetParams()");
  }
  puVar4 = (this->super_CChainParams).vFixedSeeds.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->super_CChainParams).vFixedSeeds.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (this->super_CChainParams).vFixedSeeds.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  this_01 = &(this->super_CChainParams).vSeeds;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(this_01,(this->super_CChainParams).vSeeds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[39]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [39])"testnet-seed.bitcoin.jonasschnelli.ch.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [25])"seed.tbtc.petertodd.net.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[35]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [35])"seed.testnet.bitcoin.sprovoost.nl.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[26]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [26])"testnet-seed.bluematt.me.");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[29]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_01,
             (char (*) [29])"seed.testnet.achownodes.xyz.");
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = _S_red;
  local_98[9] = _S_red >> 8;
  local_98[10] = _S_red >> 0x10;
  local_98[0xb] = _S_red >> 0x18;
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  puVar10 = (undefined1 *)operator_new(1);
  local_98[0] = SUB81(puVar10,0);
  local_98[1] = (uchar)((ulong)puVar10 >> 8);
  local_98[2] = (uchar)((ulong)puVar10 >> 0x10);
  local_98[3] = (uchar)((ulong)puVar10 >> 0x18);
  local_98[4] = (uchar)((ulong)puVar10 >> 0x20);
  local_98[5] = (uchar)((ulong)puVar10 >> 0x28);
  local_98[6] = (uchar)((ulong)puVar10 >> 0x30);
  local_98[7] = (uchar)((ulong)puVar10 >> 0x38);
  puVar12 = puVar10 + 1;
  local_98[0x10] = SUB81(puVar12,0);
  local_98[0x11] = (undefined1)((ulong)puVar12 >> 8);
  local_98[0x12] = (undefined1)((ulong)puVar12 >> 0x10);
  local_98[0x13] = (undefined1)((ulong)puVar12 >> 0x18);
  local_98[0x14] = (uchar)((ulong)puVar12 >> 0x20);
  local_98[0x15] = (uchar)((ulong)puVar12 >> 0x28);
  local_98[0x16] = (uchar)((ulong)puVar12 >> 0x30);
  local_98[0x17] = (uchar)((ulong)puVar12 >> 0x38);
  *puVar10 = 0x6f;
  local_98[8] = local_98[0x10];
  local_98[9] = local_98[0x11];
  local_98[10] = local_98[0x12];
  local_98[0xb] = local_98[0x13];
  local_98[0xc] = local_98[0x14];
  local_98[0xd] = local_98[0x15];
  local_98[0xe] = local_98[0x16];
  local_98[0xf] = local_98[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes,local_98);
  pvVar5 = (void *)CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],
                                              CONCAT14(local_98[4],
                                                       CONCAT13(local_98[3],
                                                                CONCAT12(local_98[2],
                                                                         CONCAT11(local_98[1],
                                                                                  local_98[0])))))))
  ;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_98[0x17],
                                    CONCAT16(local_98[0x16],
                                             CONCAT15(local_98[0x15],
                                                      CONCAT14(local_98[0x14],
                                                               CONCAT13(local_98[0x13],
                                                                        CONCAT12(local_98[0x12],
                                                                                 CONCAT11(local_98[
                                                  0x11],local_98[0x10]))))))) - (long)pvVar5);
  }
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = _S_red;
  local_98[9] = _S_red >> 8;
  local_98[10] = _S_red >> 0x10;
  local_98[0xb] = _S_red >> 0x18;
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  puVar10 = (undefined1 *)operator_new(1);
  local_98[0] = SUB81(puVar10,0);
  local_98[1] = (uchar)((ulong)puVar10 >> 8);
  local_98[2] = (uchar)((ulong)puVar10 >> 0x10);
  local_98[3] = (uchar)((ulong)puVar10 >> 0x18);
  local_98[4] = (uchar)((ulong)puVar10 >> 0x20);
  local_98[5] = (uchar)((ulong)puVar10 >> 0x28);
  local_98[6] = (uchar)((ulong)puVar10 >> 0x30);
  local_98[7] = (uchar)((ulong)puVar10 >> 0x38);
  puVar12 = puVar10 + 1;
  local_98[0x10] = SUB81(puVar12,0);
  local_98[0x11] = (undefined1)((ulong)puVar12 >> 8);
  local_98[0x12] = (undefined1)((ulong)puVar12 >> 0x10);
  local_98[0x13] = (undefined1)((ulong)puVar12 >> 0x18);
  local_98[0x14] = (uchar)((ulong)puVar12 >> 0x20);
  local_98[0x15] = (uchar)((ulong)puVar12 >> 0x28);
  local_98[0x16] = (uchar)((ulong)puVar12 >> 0x30);
  local_98[0x17] = (uchar)((ulong)puVar12 >> 0x38);
  *puVar10 = 0xc4;
  local_98[8] = local_98[0x10];
  local_98[9] = local_98[0x11];
  local_98[10] = local_98[0x12];
  local_98[0xb] = local_98[0x13];
  local_98[0xc] = local_98[0x14];
  local_98[0xd] = local_98[0x15];
  local_98[0xe] = local_98[0x16];
  local_98[0xf] = local_98[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 1,local_98);
  pvVar5 = (void *)CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],
                                              CONCAT14(local_98[4],
                                                       CONCAT13(local_98[3],
                                                                CONCAT12(local_98[2],
                                                                         CONCAT11(local_98[1],
                                                                                  local_98[0])))))))
  ;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_98[0x17],
                                    CONCAT16(local_98[0x16],
                                             CONCAT15(local_98[0x15],
                                                      CONCAT14(local_98[0x14],
                                                               CONCAT13(local_98[0x13],
                                                                        CONCAT12(local_98[0x12],
                                                                                 CONCAT11(local_98[
                                                  0x11],local_98[0x10]))))))) - (long)pvVar5);
  }
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x0;
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  local_98[8] = _S_red;
  local_98[9] = _S_red >> 8;
  local_98[10] = _S_red >> 0x10;
  local_98[0xb] = _S_red >> 0x18;
  local_98[0xc] = '\0';
  local_98[0xd] = '\0';
  local_98[0xe] = '\0';
  local_98[0xf] = '\0';
  local_98[0x10] = '\0';
  local_98[0x11] = '\0';
  local_98[0x12] = '\0';
  local_98[0x13] = '\0';
  local_98[0x14] = '\0';
  local_98[0x15] = '\0';
  local_98[0x16] = '\0';
  local_98[0x17] = '\0';
  puVar10 = (undefined1 *)operator_new(1);
  local_98[0] = SUB81(puVar10,0);
  local_98[1] = (uchar)((ulong)puVar10 >> 8);
  local_98[2] = (uchar)((ulong)puVar10 >> 0x10);
  local_98[3] = (uchar)((ulong)puVar10 >> 0x18);
  local_98[4] = (uchar)((ulong)puVar10 >> 0x20);
  local_98[5] = (uchar)((ulong)puVar10 >> 0x28);
  local_98[6] = (uchar)((ulong)puVar10 >> 0x30);
  local_98[7] = (uchar)((ulong)puVar10 >> 0x38);
  puVar12 = puVar10 + 1;
  local_98[0x10] = SUB81(puVar12,0);
  local_98[0x11] = (undefined1)((ulong)puVar12 >> 8);
  local_98[0x12] = (undefined1)((ulong)puVar12 >> 0x10);
  local_98[0x13] = (undefined1)((ulong)puVar12 >> 0x18);
  local_98[0x14] = (uchar)((ulong)puVar12 >> 0x20);
  local_98[0x15] = (uchar)((ulong)puVar12 >> 0x28);
  local_98[0x16] = (uchar)((ulong)puVar12 >> 0x30);
  local_98[0x17] = (uchar)((ulong)puVar12 >> 0x38);
  *puVar10 = 0xef;
  local_98[8] = local_98[0x10];
  local_98[9] = local_98[0x11];
  local_98[10] = local_98[0x12];
  local_98[0xb] = local_98[0x13];
  local_98[0xc] = local_98[0x14];
  local_98[0xd] = local_98[0x15];
  local_98[0xe] = local_98[0x16];
  local_98[0xf] = local_98[0x17];
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((this->super_CChainParams).base58Prefixes + 2,local_98);
  pvVar5 = (void *)CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],
                                              CONCAT14(local_98[4],
                                                       CONCAT13(local_98[3],
                                                                CONCAT12(local_98[2],
                                                                         CONCAT11(local_98[1],
                                                                                  local_98[0])))))))
  ;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_98[0x17],
                                    CONCAT16(local_98[0x16],
                                             CONCAT15(local_98[0x15],
                                                      CONCAT14(local_98[0x14],
                                                               CONCAT13(local_98[0x13],
                                                                        CONCAT12(local_98[0x12],
                                                                                 CONCAT11(local_98[
                                                  0x11],local_98[0x10]))))))) - (long)pvVar5);
  }
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_98[1] = '5';
  local_98[2] = 0x87;
  local_98[3] = 0xcf;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 3),local_98);
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0x4;
  local_98[1] = '5';
  local_98[2] = 0x83;
  local_98[3] = 0x94;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)
             ((this->super_CChainParams).base58Prefixes + 4));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&(this->super_CChainParams).bech32_hrp,0,
             (this->super_CChainParams).bech32_hrp._M_string_length,"tb",2);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_98,chainparams_seed_test,
             "\"\x02",(allocator_type *)local_c8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(this->super_CChainParams).vFixedSeeds,local_98);
  pvVar5 = (void *)CONCAT17(local_98[7],
                            CONCAT16(local_98[6],
                                     CONCAT15(local_98[5],
                                              CONCAT14(local_98[4],
                                                       CONCAT13(local_98[3],
                                                                CONCAT12(local_98[2],
                                                                         CONCAT11(local_98[1],
                                                                                  local_98[0])))))))
  ;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,CONCAT17(local_98[0x17],
                                    CONCAT16(local_98[0x16],
                                             CONCAT15(local_98[0x15],
                                                      CONCAT14(local_98[0x14],
                                                               CONCAT13(local_98[0x13],
                                                                        CONCAT12(local_98[0x12],
                                                                                 CONCAT11(local_98[
                                                  0x11],local_98[0x10]))))))) - (long)pvVar5);
  }
  (this->super_CChainParams).fDefaultConsistencyChecks = false;
  (this->super_CChainParams).m_is_mockable_chain = false;
  local_b8 = (pointer)0x35fce2f3556c559c;
  auStack_b0[0] = '<';
  auStack_b0[1] = 'L';
  auStack_b0[2] = 0x90;
  auStack_b0[3] = 'c';
  auStack_b0[4] = 0xa7;
  auStack_b0[5] = 'l';
  auStack_b0[6] = 0x93;
  auStack_b0[7] = '*';
  uStack_c0 = 0x214345d31b1bceb;
  local_c8 = (undefined1  [8])0xf76acb7000000222;
  auStack_b0[8] = '\0';
  auStack_b0[9] = '\0';
  auStack_b0[10] = '\0';
  auStack_b0[0xb] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_c8;
  std::map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>::map
            ((map<int,_uint256,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_> *)
             local_98,__l,(less<int> *)&local_d0,&local_d1);
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
           *)&(this->super_CChainParams).checkpointData);
  p_Var8 = (_Base_ptr)CONCAT44(auStack_74,local_98._32_4_);
  p_Var6 = (_Base_ptr)
           CONCAT17(local_98[0x17],
                    CONCAT16(local_98[0x16],
                             CONCAT15(local_98[0x15],
                                      CONCAT14(local_98[0x14],
                                               CONCAT13(local_98[0x13],
                                                        CONCAT12(local_98[0x12],
                                                                 CONCAT11(local_98[0x11],
                                                                          local_98[0x10])))))));
  if (p_Var6 != (_Base_ptr)0x0) {
    p_Var8 = (_Base_ptr)(local_98 + 8);
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_header._M_color =
         CONCAT13(local_98[0xb],CONCAT12(local_98[10],CONCAT11(local_98[9],local_98[8])));
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 8) = p_Var6;
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x10) =
         (_Base_ptr)
         CONCAT17(local_98[0x1f],
                  CONCAT16(local_98[0x1e],
                           CONCAT15(local_98[0x1d],
                                    CONCAT14(local_98[0x1c],
                                             CONCAT13(local_98[0x1b],
                                                      CONCAT12(local_98[0x1a],
                                                               CONCAT11(local_98[0x19],
                                                                        local_98[0x18])))))));
    *(_Base_ptr *)
     ((long)&(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
             super__Rb_tree_header._M_header + 0x18) =
         (_Base_ptr)CONCAT44(auStack_74,local_98._32_4_);
    p_Var6->_M_parent =
         &(this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.
          super__Rb_tree_header._M_header;
    (this->super_CChainParams).checkpointData.mapCheckpoints._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = local_70;
    local_98[0x10] = _S_red;
    local_98[0x11] = _S_red >> 8;
    local_98[0x12] = _S_red >> 0x10;
    local_98[0x13] = _S_red >> 0x18;
    local_98[0x14] = '\0';
    local_98[0x15] = '\0';
    local_98[0x16] = '\0';
    local_98[0x17] = '\0';
    local_98[0x18] = (uchar)p_Var8;
    local_98[0x19] = (uchar)((ulong)p_Var8 >> 8);
    local_98[0x1a] = (uchar)((ulong)p_Var8 >> 0x10);
    local_98[0x1b] = (uchar)((ulong)p_Var8 >> 0x18);
    local_98[0x1c] = (uchar)((ulong)p_Var8 >> 0x20);
    local_98[0x1d] = (uchar)((ulong)p_Var8 >> 0x28);
    local_98[0x1e] = (uchar)((ulong)p_Var8 >> 0x30);
    local_98[0x1f] = (uchar)((ulong)p_Var8 >> 0x38);
    local_70 = 0;
  }
  unique0x10004e90 = p_Var8;
  std::
  _Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_uint256>,_std::_Select1st<std::pair<const_int,_uint256>_>,_std::less<int>,_std::allocator<std::pair<const_int,_uint256>_>_>
               *)local_98);
  local_98[0] = (vector<unsigned_char,std::allocator<unsigned_char>>)0xa0;
  local_98[1] = '%';
  local_98[2] = '&';
  local_98[3] = '\0';
  local_98[4] = 0xe7;
  local_98[5] = '\x1b';
  local_98[6] = '\a';
  local_98[7] = 0xb8;
  local_98[8] = 0x8d;
  local_98[9] = 0xa6;
  local_98[10] = 0x3c;
  local_98[0xb] = 0x6c;
  local_98[0xc] = 0xee;
  local_98[0xd] = 'A';
  local_98[0xe] = 0x8f;
  local_98[0xf] = 0x81;
  local_98[0x10] = 0xcd;
  local_98[0x11] = '(';
  local_98[0x12] = 0x91;
  local_98[0x13] = 0xcd;
  local_98[0x14] = '\x7f';
  local_98[0x15] = 0xe3;
  local_98[0x16] = '4';
  local_98[0x17] = 'R';
  local_98[0x18] = '4';
  local_98[0x19] = 'R';
  local_98[0x1a] = 'y';
  local_98[0x1b] = 0x89;
  local_98[0x1c] = 'G';
  local_98[0x1d] = 0x8e;
  local_98[0x1e] = 0xf6;
  local_98[0x1f] = '\t';
  local_98[0x20] = 'I';
  local_98[0x21] = 'X';
  local_98[0x22] = 'A';
  local_98[0x23] = 0xf8;
  local_70 = 0x3f67948;
  local_68[0] = 'o';
  local_68[1] = ' ';
  local_68[2] = 's';
  local_68[3] = '\x1d';
  local_68[4] = '#';
  local_68[5] = 0xf9;
  local_68[6] = 0xcd;
  local_68[7] = 0xa2;
  local_68[8] = 0xeb;
  local_68[9] = 0xea;
  local_68[10] = 0xa2;
  local_68[0xb] = 'H';
  local_68[0xc] = 0xd3;
  local_68[0xd] = 'r';
  local_68[0xe] = '%';
  local_68[0xf] = '%';
  local_68._16_8_ = 0xbcb68c03a9a168ae;
  local_68[0x18] = 0x93;
  local_68._25_4_ = 0;
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  std::vector<AssumeutxoData,std::allocator<AssumeutxoData>>::_M_assign_aux<AssumeutxoData_const*>
            ((vector<AssumeutxoData,std::allocator<AssumeutxoData>> *)
             &(this->super_CChainParams).m_assumeutxo_data,local_98);
  (this->super_CChainParams).chainTxData.nTime = 0x66bc409d;
  (this->super_CChainParams).chainTxData.tx_count = 0xb33631a;
  (this->super_CChainParams).chainTxData.dTxRate = 3.265051477698455;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTestNetParams() {
        m_chain_type = ChainType::TESTNET;
        consensus.signet_blocks = false;
        consensus.signet_challenge.clear();
        consensus.nSubsidyHalvingInterval = 210000;
        consensus.script_flag_exceptions.emplace( // BIP16 exception
            uint256{"00000000dd30457c001f4095d208cc1296b0eed002427aa599874af7a432b105"}, SCRIPT_VERIFY_NONE);
        consensus.BIP34Height = 21111;
        consensus.BIP34Hash = uint256{"0000000023b3a96d3484e5abb3755c413e7d41500f8e2a5c3f0dd01299cd8ef8"};
        consensus.BIP65Height = 581885; // 00000000007f6655f22f98e72ed80d8b06dc761d5da09df0fa1dc4be4f861eb6
        consensus.BIP66Height = 330776; // 000000002104c8c45e99a8853285a3b592602a3ccde2b832481da85e9e4ba182
        consensus.CSVHeight = 770112; // 00000000025e930139bac5c6c31a403776da130831ab85be56578f3fa75369bb
        consensus.SegwitHeight = 834624; // 00000000002b980fcd729daaa248fd9316a5200e9b367f4ff2c42453e84201ca
        consensus.MinBIP9WarningHeight = 836640; // segwit activation height + miner confirmation window
        consensus.powLimit = uint256{"00000000ffffffffffffffffffffffffffffffffffffffffffffffffffffffff"};
        consensus.nPowTargetTimespan = 14 * 24 * 60 * 60; // two weeks
        consensus.nPowTargetSpacing = 10 * 60;
        consensus.fPowAllowMinDifficultyBlocks = true;
        consensus.enforce_BIP94 = false;
        consensus.fPowNoRetargeting = false;
        consensus.nRuleChangeActivationThreshold = 1512; // 75% for testchains
        consensus.nMinerConfirmationWindow = 2016; // nPowTargetTimespan / nPowTargetSpacing
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].bit = 28;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nStartTime = Consensus::BIP9Deployment::NEVER_ACTIVE;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].nTimeout = Consensus::BIP9Deployment::NO_TIMEOUT;
        consensus.vDeployments[Consensus::DEPLOYMENT_TESTDUMMY].min_activation_height = 0; // No activation delay

        // Deployment of Taproot (BIPs 340-342)
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].bit = 2;
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nStartTime = 1619222400; // April 24th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].nTimeout = 1628640000; // August 11th, 2021
        consensus.vDeployments[Consensus::DEPLOYMENT_TAPROOT].min_activation_height = 0; // No activation delay

        consensus.nMinimumChainWork = uint256{"000000000000000000000000000000000000000000000f209695166be8b61fa9"};
        consensus.defaultAssumeValid = uint256{"000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad"}; // 2873500

        pchMessageStart[0] = 0x0b;
        pchMessageStart[1] = 0x11;
        pchMessageStart[2] = 0x09;
        pchMessageStart[3] = 0x07;
        nDefaultPort = 18333;
        nPruneAfterHeight = 1000;
        m_assumed_blockchain_size = 93;
        m_assumed_chain_state_size = 19;

        genesis = CreateGenesisBlock(1296688602, 414098458, 0x1d00ffff, 1, 50 * COIN);
        consensus.hashGenesisBlock = genesis.GetHash();
        assert(consensus.hashGenesisBlock == uint256{"000000000933ea01ad0ee984209779baaec3ced90fa3f408719526f8d77f4943"});
        assert(genesis.hashMerkleRoot == uint256{"4a5e1e4baab89f3a32518a88c31bc87f618f76673e2cc77ab2127b7afdeda33b"});

        vFixedSeeds.clear();
        vSeeds.clear();
        // nodes with support for servicebits filtering should be at the top
        vSeeds.emplace_back("testnet-seed.bitcoin.jonasschnelli.ch.");
        vSeeds.emplace_back("seed.tbtc.petertodd.net.");
        vSeeds.emplace_back("seed.testnet.bitcoin.sprovoost.nl.");
        vSeeds.emplace_back("testnet-seed.bluematt.me."); // Just a static list of stable node(s), only supports x9
        vSeeds.emplace_back("seed.testnet.achownodes.xyz."); // Ava Chow, only supports x1, x5, x9, x49, x809, x849, xd, x400, x404, x408, x448, xc08, xc48, x40c

        base58Prefixes[PUBKEY_ADDRESS] = std::vector<unsigned char>(1,111);
        base58Prefixes[SCRIPT_ADDRESS] = std::vector<unsigned char>(1,196);
        base58Prefixes[SECRET_KEY] =     std::vector<unsigned char>(1,239);
        base58Prefixes[EXT_PUBLIC_KEY] = {0x04, 0x35, 0x87, 0xCF};
        base58Prefixes[EXT_SECRET_KEY] = {0x04, 0x35, 0x83, 0x94};

        bech32_hrp = "tb";

        vFixedSeeds = std::vector<uint8_t>(std::begin(chainparams_seed_test), std::end(chainparams_seed_test));

        fDefaultConsistencyChecks = false;
        m_is_mockable_chain = false;

        checkpointData = {
            {
                {546, uint256{"000000002a936ca763904c3c35fce2f3556c559c0214345d31b1bcebf76acb70"}},
            }
        };

        m_assumeutxo_data = {
            {
                .height = 2'500'000,
                .hash_serialized = AssumeutxoHash{uint256{"f841584909f68e47897952345234e37fcd9128cd818f41ee6c3ca68db8071be7"}},
                .m_chain_tx_count = 66484552,
                .blockhash = consteval_ctor(uint256{"0000000000000093bcb68c03a9a168ae252572d348a2eaeba2cdf9231d73206f"}),
            }
        };

        chainTxData = ChainTxData{
            // Data from RPC: getchaintxstats 4096 000000000000000465b1a66c9f386308e8c75acef9201f3f577811da09fc90ad
            .nTime    = 1723613341,
            .tx_count = 187917082,
            .dTxRate  = 3.265051477698455,
        };
    }